

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton5.cpp
# Opt level: O0

int main(void)

{
  test1();
  test2();
  test3();
  return 0;
}

Assistant:

int main()
{
    test1();
    test2();
    test3();

    return 0;
}